

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# master_link.cpp
# Opt level: O0

Error __thiscall
miniros::MasterLink::execute
          (MasterLink *this,string *method,RpcValue *request,RpcValue *response,RpcValue *payload,
          bool wait_for_master)

{
  bool bVar1;
  byte bVar2;
  uint __seconds;
  undefined8 uVar3;
  element_type *uri;
  XmlRpcClient *pXVar4;
  undefined8 uVar5;
  void *pvVar6;
  WallDuration *rhs;
  MasterLink *in_RDI;
  byte in_R9B;
  FilterBase *filter;
  bool enabled_5;
  bool enabled_4;
  bool enabled_3;
  bool enabled_2;
  bool b;
  bool ok;
  bool slept;
  bool printed;
  bool enabled_1;
  XmlRpcClient *c;
  bool enabled;
  RPCManagerPtr manager;
  uint32_t master_port;
  string master_host;
  SteadyTime start_time;
  shared_ptr<miniros::RPCManager> *in_stack_fffffffffffffcf8;
  LogLocation *in_stack_fffffffffffffd00;
  double in_stack_fffffffffffffd08;
  undefined4 uVar7;
  uint32_t in_stack_fffffffffffffd10;
  undefined4 in_stack_fffffffffffffd14;
  Level in_stack_fffffffffffffd24;
  string *in_stack_fffffffffffffd28;
  undefined4 in_stack_fffffffffffffd30;
  Level LVar8;
  undefined4 in_stack_fffffffffffffd34;
  char *in_stack_fffffffffffffd38;
  allocator<char> *__s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd40;
  undefined4 in_stack_fffffffffffffd48;
  Level LVar9;
  undefined4 in_stack_fffffffffffffd4c;
  undefined4 in_stack_fffffffffffffd58;
  undefined1 in_stack_fffffffffffffd5c;
  byte in_stack_fffffffffffffd5d;
  undefined1 in_stack_fffffffffffffd5e;
  undefined1 in_stack_fffffffffffffd5f;
  RPCManager *in_stack_fffffffffffffd60;
  undefined7 in_stack_fffffffffffffd80;
  undefined1 in_stack_fffffffffffffd87;
  XmlRpcValue *in_stack_fffffffffffffd88;
  undefined6 in_stack_fffffffffffffd90;
  byte in_stack_fffffffffffffd96;
  undefined1 in_stack_fffffffffffffd97;
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> in_stack_fffffffffffffd98;
  byte local_25a;
  byte local_232;
  uint32_t port;
  string *host;
  RPCManager *in_stack_fffffffffffffe20;
  allocator<char> local_1b9;
  string local_1b8 [38];
  undefined1 local_192;
  allocator<char> local_191;
  string local_190 [36];
  WallDuration local_16c;
  undefined1 local_162;
  allocator<char> local_161;
  string local_160 [8];
  string local_128 [8];
  XmlRpcValue *in_stack_fffffffffffffee0;
  XmlRpcValue *in_stack_fffffffffffffee8;
  string *in_stack_fffffffffffffef0;
  undefined2 in_stack_fffffffffffffef8;
  byte bVar10;
  byte bVar11;
  undefined1 in_stack_fffffffffffffefe;
  allocator<char> in_stack_fffffffffffffeff;
  string local_100 [39];
  undefined1 local_d9 [33];
  XmlRpcClient *local_b8;
  undefined4 local_b0;
  undefined1 local_aa;
  allocator<char> local_a9;
  string local_a8 [48];
  __shared_ptr local_78 [20];
  uint32_t local_64;
  string local_60 [36];
  TimeBase<miniros::SteadyTime,_miniros::WallDuration> local_3c;
  byte local_31;
  Error local_4;
  
  local_31 = in_R9B & 1;
  if (in_RDI->internal_ == (Internal *)0x0) {
    Error::Error(&local_4,InternalError);
  }
  else {
    local_3c = (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
    getHost_abi_cxx11_((MasterLink *)in_stack_fffffffffffffcf8);
    local_64 = getPort(in_RDI);
    std::shared_ptr<miniros::RPCManager>::shared_ptr
              ((shared_ptr<miniros::RPCManager> *)in_stack_fffffffffffffd00,
               in_stack_fffffffffffffcf8);
    bVar1 = std::__shared_ptr::operator_cast_to_bool(local_78);
    LVar8 = (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
    if (bVar1) {
      uri = std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x458521);
      host = (string *)local_d9;
      port = local_64;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                 (allocator<char> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      pXVar4 = RPCManager::getXMLRPCClient(in_stack_fffffffffffffe20,host,port,&uri->uri_);
      std::__cxx11::string::~string((string *)(local_d9 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_d9);
      LVar8 = (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
      local_b8 = pXVar4;
      if (pXVar4 == (XmlRpcClient *)0x0) {
        if (((console::g_initialized ^ 0xff) & 1) != 0) {
          console::initialize();
        }
        if (((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.initialized_ ^ 0xffU) & 1) != 0) {
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                     (allocator<char> *)
                     CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
          console::initializeLogLocation
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                     in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
          std::__cxx11::string::~string(local_100);
          std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffeff);
        }
        if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
            ::loc.level_ != Error) {
          console::setLogLocationLevel(in_stack_fffffffffffffd00,LVar8);
          console::checkLogLocationEnabled
                    ((LogLocation *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
        }
        pvVar6 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                 ::loc.logger_;
        LVar8 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.level_;
        if ((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
             ::loc.logger_enabled_ & 1U) != 0) {
          uVar3 = std::__cxx11::string::c_str();
          uVar5 = std::__cxx11::string::c_str();
          console::print((FilterBase *)0x0,pvVar6,(Level)(ulong)LVar8,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                         ,0xd0,
                         "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                         ,"[%s] - failed make connection to host=\"%s:%d\"",uVar3,uVar5,local_64);
        }
        Error::Error(&local_4,InvalidURI);
      }
      else {
        bVar11 = 0;
        bVar10 = 0;
        do {
          __seconds = std::__cxx11::string::c_str();
          bVar2 = XmlRpc::XmlRpcClient::execute
                            ((XmlRpcClient *)in_stack_fffffffffffffd98,
                             (char *)CONCAT17(in_stack_fffffffffffffd97,
                                              CONCAT16(in_stack_fffffffffffffd96,
                                                       in_stack_fffffffffffffd90)),
                             in_stack_fffffffffffffd88,
                             (XmlRpcValue *)
                             CONCAT17(in_stack_fffffffffffffd87,in_stack_fffffffffffffd80));
          bVar1 = isShuttingDown();
          local_232 = 0;
          if (!bVar1) {
            std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x4588d1);
            bVar1 = RPCManager::isShuttingDown((RPCManager *)0x4588d9);
            local_232 = bVar1 ^ 0xff;
          }
          LVar8 = (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
          local_232 = local_232 & 1;
          if (((bVar2 & 1) != 0) || (local_232 == 0)) {
            std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x458f58);
            in_stack_fffffffffffffd5f =
                 RPCManager::validateXmlrpcResponse
                           ((RPCManager *)
                            CONCAT17(in_stack_fffffffffffffeff,
                                     CONCAT16(in_stack_fffffffffffffefe,
                                              CONCAT15(bVar11,CONCAT14(bVar10,CONCAT13(local_232,
                                                                                       CONCAT12(
                                                  bVar2,in_stack_fffffffffffffef8)))))),
                            in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                            in_stack_fffffffffffffee0);
            if (!(bool)in_stack_fffffffffffffd5f) {
              std::
              __shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x458f95);
              RPCManager::releaseXMLRPCClient
                        (in_stack_fffffffffffffd60,
                         (XmlRpcClient *)
                         CONCAT17(in_stack_fffffffffffffd5f,
                                  CONCAT16(in_stack_fffffffffffffd5e,
                                           CONCAT15(in_stack_fffffffffffffd5d,
                                                    CONCAT14(in_stack_fffffffffffffd5c,
                                                             in_stack_fffffffffffffd58)))));
              Error::Error(&local_4,InvalidResponse);
              goto LAB_004593f9;
            }
            break;
          }
          if (((bVar11 & 1) == 0) && ((local_31 & 1) != 0)) {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
              __seconds = (uint)local_128;
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
              std::__cxx11::string::~string(local_128);
              std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffed7);
            }
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.level_ != Error) {
              __seconds = 3;
              console::setLogLocationLevel
                        (in_stack_fffffffffffffd00,(Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20)
                        );
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
            }
            pvVar6 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                     ::loc.logger_;
            LVar8 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                    ::loc.level_;
            if ((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                 ::loc.logger_enabled_ & 1U) != 0) {
              in_stack_fffffffffffffd00 = (LogLocation *)std::__cxx11::string::c_str();
              in_stack_fffffffffffffd08 = (double)std::__cxx11::string::c_str();
              in_stack_fffffffffffffcf8 = (shared_ptr<miniros::RPCManager> *)0x0;
              in_stack_fffffffffffffd10 = local_64;
              console::print((FilterBase *)0x0,pvVar6,(Level)(ulong)LVar8,
                             "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                             ,0xe5,
                             "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                            );
              __seconds = (uint)pvVar6;
            }
            bVar11 = 1;
          }
          if ((local_31 & 1) == 0) {
            std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x458b66);
            RPCManager::releaseXMLRPCClient
                      (in_stack_fffffffffffffd60,
                       (XmlRpcClient *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))));
            Error::Error(&local_4,NoMaster);
            goto LAB_004593f9;
          }
          bVar1 = DurationBase<miniros::WallDuration>::isZero
                            (&(in_RDI->internal_->retry_timeout).
                              super_DurationBase<miniros::WallDuration>);
          local_25a = 0;
          in_stack_fffffffffffffd96 = local_25a;
          if (!bVar1) {
            in_stack_fffffffffffffd98 =
                 (TimeBase<miniros::SteadyTime,_miniros::WallDuration>)SteadyTime::now();
            TimeBase<miniros::SteadyTime,_miniros::WallDuration>::operator-
                      ((TimeBase<miniros::SteadyTime,_miniros::WallDuration> *)
                       CONCAT44(in_stack_fffffffffffffd4c,in_stack_fffffffffffffd48),
                       (SteadyTime *)in_stack_fffffffffffffd40);
            rhs = &in_RDI->internal_->retry_timeout;
            in_stack_fffffffffffffd96 =
                 DurationBase<miniros::WallDuration>::operator>=
                           ((DurationBase<miniros::WallDuration> *)&stack0xfffffffffffffecc,rhs);
            __seconds = (uint)rhs;
            in_stack_fffffffffffffd97 = in_stack_fffffffffffffd96;
            WallDuration::~WallDuration((WallDuration *)0x458c7a);
          }
          LVar8 = (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
          if ((in_stack_fffffffffffffd96 & 1) != 0) {
            if (((console::g_initialized ^ 0xff) & 1) != 0) {
              console::initialize();
            }
            if (((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                  ::loc.initialized_ ^ 0xffU) & 1) != 0) {
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                         (allocator<char> *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
              console::initializeLogLocation
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                         in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
              std::__cxx11::string::~string(local_160);
              std::allocator<char>::~allocator(&local_161);
            }
            if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.level_ != Error) {
              console::setLogLocationLevel(in_stack_fffffffffffffd00,LVar8);
              console::checkLogLocationEnabled
                        ((LogLocation *)
                         CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
            }
            LVar8 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                    ::loc.level_;
            local_162 = (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                         ::loc.logger_enabled_ & 1U) != 0;
            if ((bool)local_162) {
              in_stack_fffffffffffffd60 =
                   (RPCManager *)
                   execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                   ::loc.logger_;
              uVar3 = std::__cxx11::string::c_str();
              filter = (FilterBase *)
                       DurationBase<miniros::WallDuration>::toSec
                                 (&(in_RDI->internal_->retry_timeout).
                                   super_DurationBase<miniros::WallDuration>);
              console::print(filter,(void *)0x0,(Level)in_stack_fffffffffffffd60,
                             (char *)(ulong)LVar8,0x577e0c,(char *)0xef,
                             "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                             ,"[%s] Timed out trying to connect to the master after [%f] seconds",
                             uVar3);
            }
            std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x458eaf);
            RPCManager::releaseXMLRPCClient
                      (in_stack_fffffffffffffd60,
                       (XmlRpcClient *)
                       CONCAT17(in_stack_fffffffffffffd5f,
                                CONCAT16(in_stack_fffffffffffffd5e,
                                         CONCAT15(in_stack_fffffffffffffd5d,
                                                  CONCAT14(in_stack_fffffffffffffd5c,
                                                           in_stack_fffffffffffffd58)))));
            Error::Error(&local_4,NoMaster);
            goto LAB_004593f9;
          }
          WallDuration::WallDuration
                    ((WallDuration *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10),
                     in_stack_fffffffffffffd08);
          WallDuration::sleep(&local_16c,__seconds);
          WallDuration::~WallDuration((WallDuration *)0x458f18);
          bVar10 = 1;
          in_stack_fffffffffffffd5e = isShuttingDown();
          in_stack_fffffffffffffd5d = 0;
          if (!(bool)in_stack_fffffffffffffd5e) {
            std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x458ff6);
            in_stack_fffffffffffffd5c = RPCManager::isShuttingDown((RPCManager *)0x458ffe);
            in_stack_fffffffffffffd5d = in_stack_fffffffffffffd5c ^ 0xff;
          }
          LVar8 = (Level)((ulong)in_stack_fffffffffffffcf8 >> 0x20);
          local_232 = in_stack_fffffffffffffd5d & 1;
        } while (local_232 != 0);
        uVar7 = (undefined4)((ulong)in_stack_fffffffffffffd08 >> 0x20);
        if (((local_232 & 1) != 0) && ((bVar10 & 1) != 0)) {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.initialized_ ^ 0xffU) & 1) != 0) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
            console::initializeLogLocation
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
            std::__cxx11::string::~string(local_190);
            std::allocator<char>::~allocator(&local_191);
          }
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.level_ != Info) {
            console::setLogLocationLevel(in_stack_fffffffffffffd00,LVar8);
            console::checkLogLocationEnabled
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
            ;
          }
          local_192 = (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                       ::loc.logger_enabled_ & 1U) != 0;
          if ((bool)local_192) {
            in_stack_fffffffffffffd40 =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                 ::loc.logger_;
            LVar9 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                    ::loc.level_;
            in_stack_fffffffffffffd00 = (LogLocation *)std::__cxx11::string::c_str();
            LVar8 = Debug;
            console::print((FilterBase *)0x0,in_stack_fffffffffffffd40,(Level)(ulong)LVar9,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                           ,0x102,
                           "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                           ,"Connected to master at [%s:%d]",in_stack_fffffffffffffd00,
                           CONCAT44(uVar7,local_64));
          }
        }
        std::__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<miniros::RPCManager,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x4591fd);
        RPCManager::releaseXMLRPCClient
                  (in_stack_fffffffffffffd60,
                   (XmlRpcClient *)
                   CONCAT17(in_stack_fffffffffffffd5f,
                            CONCAT16(in_stack_fffffffffffffd5e,
                                     CONCAT15(in_stack_fffffffffffffd5d,
                                              CONCAT14(in_stack_fffffffffffffd5c,
                                                       in_stack_fffffffffffffd58)))));
        if ((local_232 & 1) == 0) {
          if (((console::g_initialized ^ 0xff) & 1) != 0) {
            console::initialize();
          }
          if (((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                ::loc.initialized_ ^ 0xffU) & 1) != 0) {
            __s = &local_1b9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd40,(char *)__s,
                       (allocator<char> *)
                       CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
            console::initializeLogLocation
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                       in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
            std::__cxx11::string::~string(local_1b8);
            std::allocator<char>::~allocator(&local_1b9);
          }
          if (execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
              ::loc.level_ != Error) {
            console::setLogLocationLevel(in_stack_fffffffffffffd00,LVar8);
            console::checkLogLocationEnabled
                      ((LogLocation *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10))
            ;
          }
          if ((execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
               ::loc.logger_enabled_ & 1U) != 0) {
            pvVar6 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                     ::loc.logger_;
            LVar8 = execute(std::__cxx11::string_const&,XmlRpc::XmlRpcValue_const&,XmlRpc::XmlRpcValue&,XmlRpc::XmlRpcValue&,bool)
                    ::loc.level_;
            uVar3 = std::__cxx11::string::c_str();
            console::print((FilterBase *)0x0,pvVar6,(Level)(ulong)LVar8,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                           ,0x108,
                           "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                           ,"[%s] Got shutdown request during RPC call",uVar3);
          }
          Error::Error(&local_4,ShutdownInterrupt);
        }
        else {
          Error::Error(&local_4,Ok);
        }
      }
    }
    else {
      if (((console::g_initialized ^ 0xff) & 1) != 0) {
        console::initialize();
      }
      if (((execute::loc.initialized_ ^ 0xffU) & 1) != 0) {
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd40,in_stack_fffffffffffffd38,
                   (allocator<char> *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30))
        ;
        console::initializeLogLocation
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30),
                   in_stack_fffffffffffffd28,in_stack_fffffffffffffd24);
        std::__cxx11::string::~string(local_a8);
        std::allocator<char>::~allocator(&local_a9);
      }
      if (execute::loc.level_ != Error) {
        console::setLogLocationLevel(in_stack_fffffffffffffd00,LVar8);
        console::checkLogLocationEnabled
                  ((LogLocation *)CONCAT44(in_stack_fffffffffffffd14,in_stack_fffffffffffffd10));
      }
      LVar8 = execute::loc.level_;
      local_aa = (execute::loc.logger_enabled_ & 1U) != 0;
      if ((bool)local_aa) {
        pvVar6 = execute::loc.logger_;
        uVar3 = std::__cxx11::string::c_str();
        console::print((FilterBase *)0x0,pvVar6,(Level)(ulong)LVar8,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/master_link.cpp"
                       ,0xcb,
                       "Error miniros::MasterLink::execute(const std::string &, const RpcValue &, RpcValue &, RpcValue &, bool) const"
                       ,"[%s] - no manager",uVar3);
      }
      Error::Error(&local_4,InternalError);
    }
LAB_004593f9:
    local_b0 = 1;
    std::shared_ptr<miniros::RPCManager>::~shared_ptr((shared_ptr<miniros::RPCManager> *)0x459406);
    std::__cxx11::string::~string(local_60);
  }
  return (Error)local_4.code;
}

Assistant:

Error MasterLink::execute(const std::string& method, const RpcValue& request, RpcValue& response,
  RpcValue& payload, bool wait_for_master) const
{
  if (!internal_)
    return Error::InternalError;
  miniros::SteadyTime start_time = miniros::SteadyTime::now();

  std::string master_host = getHost();
  uint32_t master_port = getPort();
  RPCManagerPtr manager = internal_->rpcManager;
  if (!manager) {
    MINIROS_ERROR("[%s] - no manager", method.c_str());
    return Error::InternalError;
  }
  XmlRpc::XmlRpcClient* c = manager->getXMLRPCClient(master_host, master_port, "/");
  if (!c) {
    MINIROS_ERROR("[%s] - failed make connection to host=\"%s:%d\"", method.c_str(), master_host.c_str(), master_port);
    return Error::InvalidURI;
  }
  bool printed = false;
  bool slept = false;
  bool ok = true;
  bool b = false;
  do {
    {
#if defined(__APPLE__)
      std::scoped_lock<std::mutex> lock(internal_->xmlrpc_call_mutex);
#endif

      b = c->execute(method.c_str(), request, response);
    }

    ok = !miniros::isShuttingDown() && !manager->isShuttingDown();

    if (!b && ok) {
      if (!printed && wait_for_master) {
        MINIROS_ERROR("[%s] Failed to contact master at [%s:%d].  %s", method.c_str(), master_host.c_str(), master_port,
          wait_for_master ? "Retrying..." : "");
        printed = true;
      }

      if (!wait_for_master) {
        manager->releaseXMLRPCClient(c);
        return Error::NoMaster;
      }

      if (!internal_->retry_timeout.isZero() && (miniros::SteadyTime::now() - start_time) >= internal_->retry_timeout) {
        MINIROS_ERROR("[%s] Timed out trying to connect to the master after [%f] seconds", method.c_str(), internal_->retry_timeout.toSec());
        manager->releaseXMLRPCClient(c);
        return Error::NoMaster;
      }

      (void)miniros::WallDuration(0.05).sleep();
      slept = true;
    } else {
      if (!manager->validateXmlrpcResponse(method, response, payload)) {
        manager->releaseXMLRPCClient(c);
        return Error::InvalidResponse;
      }
      break;
    }

    ok = !miniros::isShuttingDown() && !manager->isShuttingDown();
  } while (ok);

  if (ok && slept) {
    MINIROS_INFO("Connected to master at [%s:%d]", master_host.c_str(), master_port);
  }

  manager->releaseXMLRPCClient(c);

  if (!ok) {
    MINIROS_ERROR("[%s] Got shutdown request during RPC call", method.c_str());
    return Error::ShutdownInterrupt;
  }
  return Error::Ok;;
}